

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeout.c
# Opt level: O1

timer_element * remove_timer(timer_element **base,short func_index,void *arg)

{
  timer_element *ptVar1;
  timer_element *ptVar2;
  timer_element *ptVar3;
  
  ptVar2 = *base;
  if (ptVar2 != (timer_element *)0x0) {
    ptVar3 = (timer_element *)0x0;
    do {
      ptVar1 = ptVar2;
      if (((ushort)ptVar1->func_index == func_index) && (ptVar1->arg == arg)) {
        if (ptVar3 != (timer_element *)0x0) {
          base = &ptVar3->next;
        }
        ((timer_element *)base)->next = ptVar1->next;
        return ptVar1;
      }
      ptVar2 = ptVar1->next;
      ptVar3 = ptVar1;
    } while (ptVar2 != (timer_element *)0x0);
  }
  return ptVar2;
}

Assistant:

static timer_element *remove_timer(timer_element **base, short func_index,
				   void * arg)
{
    timer_element *prev, *curr;

    for (prev = 0, curr = *base; curr; prev = curr, curr = curr->next)
	if (curr->func_index == func_index && curr->arg == arg) break;

    if (curr) {
	if (prev)
	    prev->next = curr->next;
	else
	    *base = curr->next;
    }

    return curr;
}